

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_handle.c
# Opt level: O0

uint32_t skynet_handle_register(skynet_context *ctx)

{
  handle_storage *lock;
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  skynet_context **__s;
  int hash_1;
  skynet_context **new_slot;
  int hash;
  uint32_t handle;
  int i;
  handle_storage *s;
  skynet_context *ctx_local;
  
  lock = H;
  rwlock_wlock(&H->lock);
  do {
    for (hash = 0; hash < lock->slot_size; hash = hash + 1) {
      uVar1 = hash + lock->handle_index & 0xffffff;
      uVar2 = uVar1 & lock->slot_size - 1U;
      if (lock->slot[(int)uVar2] == (skynet_context *)0x0) {
        lock->slot[(int)uVar2] = ctx;
        lock->handle_index = uVar1 + 1;
        rwlock_wunlock(&lock->lock);
        return lock->harbor | uVar1;
      }
    }
    if (0xffffff < lock->slot_size * 2 + -1) {
      __assert_fail("(s->slot_size*2 - 1) <= HANDLE_MASK",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_handle.c"
                    ,0x37,"uint32_t skynet_handle_register(struct skynet_context *)");
    }
    __s = (skynet_context **)malloc((long)(lock->slot_size << 1) << 3);
    memset(__s,0,(long)(lock->slot_size << 1) << 3);
    for (hash = 0; hash < lock->slot_size; hash = hash + 1) {
      uVar3 = skynet_context_handle(lock->slot[hash]);
      uVar1 = uVar3 & lock->slot_size * 2 - 1U;
      if (__s[(int)uVar1] != (skynet_context *)0x0) {
        __assert_fail("new_slot[hash] == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_handle.c"
                      ,0x3c,"uint32_t skynet_handle_register(struct skynet_context *)");
      }
      __s[(int)uVar1] = lock->slot[hash];
    }
    free(lock->slot);
    lock->slot = __s;
    lock->slot_size = lock->slot_size << 1;
  } while( true );
}

Assistant:

uint32_t
skynet_handle_register(struct skynet_context *ctx) {
	struct handle_storage *s = H;

	rwlock_wlock(&s->lock);
	
	for (;;) {
		int i;
		for (i=0;i<s->slot_size;i++) {
			uint32_t handle = (i+s->handle_index) & HANDLE_MASK;
			int hash = handle & (s->slot_size-1);
			if (s->slot[hash] == NULL) {
				s->slot[hash] = ctx;
				s->handle_index = handle + 1;

				rwlock_wunlock(&s->lock);

				handle |= s->harbor;
				return handle;
			}
		}
		assert((s->slot_size*2 - 1) <= HANDLE_MASK);
		struct skynet_context ** new_slot = skynet_malloc(s->slot_size * 2 * sizeof(struct skynet_context *));
		memset(new_slot, 0, s->slot_size * 2 * sizeof(struct skynet_context *));
		for (i=0;i<s->slot_size;i++) {
			int hash = skynet_context_handle(s->slot[i]) & (s->slot_size * 2 - 1);
			assert(new_slot[hash] == NULL);
			new_slot[hash] = s->slot[i];
		}
		skynet_free(s->slot);
		s->slot = new_slot;
		s->slot_size *= 2;
	}
}